

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O2

uint __thiscall
ON_FunctionList::IsInList
          (ON_FunctionList *this,_func_void_ON__UINT_PTR *function,ON__UINT_PTR function_parameter)

{
  bool bVar1;
  uint uVar2;
  
  if (function == (_func_void_ON__UINT_PTR *)0x0) {
    uVar2 = 2;
  }
  else {
    bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
    uVar2 = 0;
    if (bVar1) {
      if (this->m_head == (void *)0x0) {
        uVar2 = 2;
      }
      else {
        uVar2 = (*(ON__UINT_PTR *)((long)this->m_head + 0x18) != function_parameter) + 1;
      }
      ON_Lock::ReturnDefaultLock(&this->m_lock);
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_FunctionList::IsInList(
    void (*function)(ON__UINT_PTR),
    ON__UINT_PTR function_parameter
    ) const
{
  if ( 0 == function)
    return 2;

  if ( false == m_lock.GetDefaultLock() )
    return 0;

  int rc = 2;
  struct tagFunctionItem* item = FindItem((struct tagFunctionItem*)m_head,function);
  if ( item && item->m_function_parameter == function_parameter )
  {
    rc = 1;
  }

  m_lock.ReturnDefaultLock();

  return rc;
}